

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::Checkbox(char *label,bool *v)

{
  float text_baseline_y;
  ImVec2 IVar1;
  uint uVar2;
  ImGuiWindow *this;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImGuiID id;
  ImU32 IVar6;
  int iVar7;
  char *text;
  int idx;
  bool *pbVar8;
  ImVec2 pos;
  float fVar9;
  bool held;
  bool hovered;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  bool *local_98;
  ImVec2 local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float local_68;
  float fStack_64;
  undefined8 uStack_60;
  ImVec2 local_58;
  ImRect total_bb;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    local_98 = v;
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    local_58 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_78 = GetFrameHeight();
    IVar1 = (this->DC).CursorPos;
    local_68 = IVar1.x;
    fStack_64 = IVar1.y;
    fVar9 = 0.0;
    if (0.0 < local_58.x) {
      fVar9 = (pIVar3->Style).ItemInnerSpacing.x + local_58.x;
    }
    text_baseline_y = (pIVar3->Style).FramePadding.y;
    uStack_60 = 0;
    total_bb.Max.x = fVar9 + local_78 + local_68;
    total_bb.Min = IVar1;
    total_bb.Max.y = text_baseline_y + text_baseline_y + local_58.y + fStack_64;
    ItemSize(&total_bb,text_baseline_y);
    bVar5 = false;
    bVar4 = ItemAdd(&total_bb,id,(ImRect *)0x0,0);
    if (bVar4) {
      bVar5 = ButtonBehavior(&total_bb,id,&hovered,&held,0);
      if (bVar5) {
        *local_98 = (bool)(*local_98 ^ 1);
        MarkItemEdited(id);
      }
      local_a8.y = fStack_64;
      local_a8.x = local_68;
      local_88 = local_78 + local_68;
      fStack_84 = local_78 + fStack_64;
      fStack_80 = local_78 + (float)uStack_60;
      fStack_7c = local_78 + (float)((ulong)uStack_60 >> 0x20);
      uStack_a0 = 0;
      RenderNavHighlight(&total_bb,id,1);
      iVar7 = ((held ^ 1U) & hovered) + 7;
      idx = 9;
      if ((hovered & 1U) == 0) {
        idx = iVar7;
      }
      if (held == false) {
        idx = iVar7;
      }
      IVar6 = GetColorU32(idx,1.0);
      IVar1.y = fStack_84;
      IVar1.x = local_88;
      RenderFrame(local_a8,IVar1,IVar6,true,(pIVar3->Style).FrameRounding);
      IVar6 = GetColorU32(0x12,1.0);
      pbVar8 = local_98;
      uVar2 = (pIVar3->LastItemData).InFlags;
      if ((uVar2 & 0x40) == 0) {
        fVar9 = local_a8.y;
        if (*local_98 != false) {
          fVar9 = 1.0;
          if (1.0 <= (float)(int)(local_78 / 6.0)) {
            fVar9 = (float)(int)(local_78 / 6.0);
          }
          pos.x = local_68 + fVar9;
          local_a8.x = local_a8.y;
          uStack_a0 = CONCAT44(local_a8.y,local_a8.y);
          pos.y = local_a8.y + fVar9;
          RenderCheckMark(this->DrawList,pos,IVar6,local_78 - (fVar9 + fVar9));
          fVar9 = local_a8.x;
        }
      }
      else {
        fVar9 = 1.0;
        if (1.0 <= (float)(int)(local_78 / 3.6)) {
          fVar9 = (float)(int)(local_78 / 3.6);
        }
        local_a8.x = local_a8.y;
        uStack_a0 = CONCAT44(local_a8.y,local_a8.y);
        local_90.y = local_a8.y + fVar9;
        local_90.x = local_68 + fVar9;
        local_38.x = local_88 - fVar9;
        local_38.y = fStack_84 - fVar9;
        ImDrawList::AddRectFilled
                  (this->DrawList,&local_90,&local_38,IVar6,(pIVar3->Style).FrameRounding,0);
        pbVar8 = local_98;
        fVar9 = local_a8.x;
      }
      local_90.y = (pIVar3->Style).FramePadding.y + fVar9;
      local_90.x = (pIVar3->Style).ItemInnerSpacing.x + local_88;
      if (pIVar3->LogEnabled == true) {
        if ((uVar2 & 0x40) == 0) {
          text = "[ ]";
          if (*pbVar8 != false) {
            text = "[x]";
          }
        }
        else {
          text = "[~]";
        }
        LogRenderedText(&local_90,text,(char *)0x0);
      }
      if (0.0 < local_58.x) {
        RenderText(local_90,label,(char *)0x0,true);
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}